

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void calcNodesMatricesRecursive(cgltf_node *node,mat4 *parentMat)

{
  cgltf_node **ppcVar1;
  cgltf_size cVar2;
  cgltf_node *node_00;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  NodeData *pNVar10;
  mat<4,4,float,(glm::qualifier)0> *this;
  vec<3,_float,_(glm::qualifier)0> *v;
  qua<float,_(glm::qualifier)0> *extraout_RDX;
  qua<float,_(glm::qualifier)0> *extraout_RDX_00;
  qua<float,_(glm::qualifier)0> *extraout_RDX_01;
  qua<float,_(glm::qualifier)0> *extraout_RDX_02;
  qua<float,_(glm::qualifier)0> *q;
  vec3 *m;
  long lVar11;
  size_t i;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  undefined1 local_b8 [32];
  col_type local_98;
  col_type local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 local_54;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined8 local_3c;
  undefined8 uStack_34;
  undefined4 local_2c;
  
  v = (vec<3,_float,_(glm::qualifier)0> *)0xd8;
  i = (size_t)(int)(((long)node - (long)parsedData->nodes) / 0xd8);
  if (anims::playingInd == 0) {
    pNVar10 = (NodeData *)0x0;
  }
  else {
    pNVar10 = tl::Vector<anims::NodeData>::operator[]
                        ((Vector<anims::NodeData> *)&anims::nodesData,i);
  }
  this = (mat<4,4,float,(glm::qualifier)0> *)
         tl::Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::operator[]
                   ((Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)anims::nodesMatrices,i);
  uVar3 = *(undefined8 *)parentMat->value;
  uVar4 = *(undefined8 *)&parentMat->value[0].field_2;
  uVar5 = *(undefined8 *)(parentMat->value + 1);
  uVar6 = *(undefined8 *)&parentMat->value[1].field_2;
  uVar7 = *(undefined8 *)(parentMat->value + 2);
  uVar8 = *(undefined8 *)&parentMat->value[2].field_2;
  uVar9 = *(undefined8 *)&parentMat->value[3].field_2;
  *(undefined8 *)(this + 0x30) = *(undefined8 *)(parentMat->value + 3);
  *(undefined8 *)(this + 0x38) = uVar9;
  *(undefined8 *)(this + 0x20) = uVar7;
  *(undefined8 *)(this + 0x28) = uVar8;
  *(undefined8 *)(this + 0x10) = uVar5;
  *(undefined8 *)(this + 0x18) = uVar6;
  *(undefined8 *)this = uVar3;
  *(undefined8 *)(this + 8) = uVar4;
  q = extraout_RDX;
  if (node->has_matrix != 0) {
    local_b8._16_4_ =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)node->matrix[0];
    local_b8._20_4_ =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)node->matrix[1];
    local_b8._24_4_ =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)node->matrix[2];
    local_b8._28_4_ =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)node->matrix[3];
    local_98.field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)node->matrix[4];
    local_98.field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)node->matrix[5];
    local_98.field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)node->matrix[6];
    local_98.field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)node->matrix[7];
    local_88.field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)node->matrix[8];
    local_88.field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)node->matrix[9];
    local_88.field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)node->matrix[10];
    local_88.field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)node->matrix[0xb];
    local_78 = *(undefined8 *)(node->matrix + 0xc);
    uStack_70 = *(undefined8 *)(node->matrix + 0xe);
    glm::mat<4,4,float,(glm::qualifier)0>::operator*=
              (this,(mat<4,_4,_float,_(glm::qualifier)0> *)(local_b8 + 0x10));
    q = extraout_RDX_00;
  }
  if ((pNVar10 == (NodeData *)0x0) ||
     (q = (qua<float,_(glm::qualifier)0> *)pNVar10->position,
     q == (qua<float,_(glm::qualifier)0> *)0x0)) {
    if (node->has_translation != 0) {
      local_68 = 0x3f800000;
      uStack_64 = 0;
      uStack_60 = 0;
      uStack_5c = 0;
      uStack_58 = 0;
      local_54 = 0x3f800000;
      local_50 = 0;
      uStack_48 = 0;
      local_40 = 0x3f800000;
      local_3c = 0;
      uStack_34 = 0;
      local_2c = 0x3f800000;
      local_b8._8_4_ =
           *(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)
            (node->translation + 2);
      local_b8._0_4_ =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)node->translation[0];
      local_b8._4_4_ =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)node->translation[1];
      glm::translate<float,(glm::qualifier)0>
                ((mat<4,_4,_float,_(glm::qualifier)0> *)(local_b8 + 0x10),(glm *)&local_68,
                 (mat<4,_4,_float,_(glm::qualifier)0> *)local_b8,v);
      glm::mat<4,4,float,(glm::qualifier)0>::operator*=
                (this,(mat<4,_4,_float,_(glm::qualifier)0> *)(local_b8 + 0x10));
      q = extraout_RDX_02;
    }
    if (pNVar10 != (NodeData *)0x0) goto LAB_0011264f;
LAB_00112672:
    if (node->has_rotation != 0) {
      local_68 = (undefined4)*(undefined8 *)node->rotation;
      uStack_64 = (undefined4)((ulong)*(undefined8 *)node->rotation >> 0x20);
      uStack_60 = (undefined4)*(undefined8 *)(node->rotation + 2);
      uStack_5c = (undefined4)((ulong)*(undefined8 *)(node->rotation + 2) >> 0x20);
      glm::mat4_cast<float,(glm::qualifier)0>
                ((mat<4,_4,_float,_(glm::qualifier)0> *)(local_b8 + 0x10),(glm *)&local_68,q);
      glm::mat<4,4,float,(glm::qualifier)0>::operator*=
                (this,(mat<4,_4,_float,_(glm::qualifier)0> *)(local_b8 + 0x10));
    }
    if (pNVar10 != (NodeData *)0x0) goto LAB_001126a1;
LAB_001126d0:
    if (node->has_scale == 0) goto LAB_0011272b;
    local_b8._8_4_ =
         *(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)(node->scale + 2);
    local_b8._0_4_ = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)node->scale[0];
    local_b8._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)node->scale[1];
    m = (vec3 *)local_b8;
  }
  else {
    local_68 = 0x3f800000;
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    uStack_58 = 0;
    local_54 = 0x3f800000;
    local_50 = 0;
    uStack_48 = 0;
    local_40 = 0x3f800000;
    local_3c = 0;
    uStack_34 = 0;
    local_2c = 0x3f800000;
    glm::translate<float,(glm::qualifier)0>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)(local_b8 + 0x10),(glm *)&local_68,
               (mat<4,_4,_float,_(glm::qualifier)0> *)q,v);
    glm::mat<4,4,float,(glm::qualifier)0>::operator*=
              (this,(mat<4,_4,_float,_(glm::qualifier)0> *)(local_b8 + 0x10));
    q = extraout_RDX_01;
LAB_0011264f:
    if (pNVar10->rotation == (quat *)0x0) goto LAB_00112672;
    glm::mat4_cast<float,(glm::qualifier)0>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)(local_b8 + 0x10),(glm *)pNVar10->rotation,q);
    glm::mat<4,4,float,(glm::qualifier)0>::operator*=
              (this,(mat<4,_4,_float,_(glm::qualifier)0> *)(local_b8 + 0x10));
LAB_001126a1:
    m = pNVar10->scale;
    if (m == (vec3 *)0x0) goto LAB_001126d0;
  }
  local_2c = 0x3f800000;
  uStack_34 = 0;
  local_3c = 0;
  local_40 = 0x3f800000;
  uStack_48 = 0;
  local_50 = 0;
  local_54 = 0x3f800000;
  uStack_58 = 0;
  uStack_5c = 0;
  uStack_60 = 0;
  uStack_64 = 0;
  local_68 = 0x3f800000;
  glm::scale<float,(glm::qualifier)0>
            ((mat<4,_4,_float,_(glm::qualifier)0> *)(local_b8 + 0x10),(glm *)&local_68,
             (mat<4,_4,_float,_(glm::qualifier)0> *)m,v);
  glm::mat<4,4,float,(glm::qualifier)0>::operator*=
            (this,(mat<4,_4,_float,_(glm::qualifier)0> *)(local_b8 + 0x10));
LAB_0011272b:
  ppcVar1 = node->children;
  cVar2 = node->children_count;
  lVar11 = 0;
  while( true ) {
    if (cVar2 << 3 == lVar11) {
      return;
    }
    node_00 = *(cgltf_node **)((long)ppcVar1 + lVar11);
    if (node_00 == (cgltf_node *)0x0) break;
    calcNodesMatricesRecursive(node_00,(mat4 *)this);
    lVar11 = lVar11 + 8;
  }
  __assert_fail("child",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                ,0x251,"void calcNodesMatricesRecursive(const cgltf_node &, const glm::mat4 &)");
}

Assistant:

static void calcNodesMatricesRecursive(const cgltf_node& node, const glm::mat4& parentMat = glm::mat4(1.0))
{
    const i32 nodeInd = getNodeInd(&node);
    const auto animData = anims::playingInd ? &anims::nodesData[nodeInd] : nullptr;
    glm::mat4& mtx = anims::nodesMatrices[nodeInd];
    mtx = parentMat;
    if(node.has_matrix)
        mtx *= glm::make_mat4(node.matrix);

    if(animData && animData->position)
        mtx *= glm::translate(glm::mat4(1), *animData->position);
    else if(node.has_translation)
        mtx *= glm::translate(glm::mat4(1), {node.translation[0], node.translation[1], node.translation[2]});

    if(animData && animData->rotation)
        mtx *= glm::toMat4(*animData->rotation);
    else if(node.has_rotation)
        mtx *= glm::toMat4(glm::quat(node.rotation[3], node.rotation[0], node.rotation[1], node.rotation[2]));

    if(animData && animData->scale)
        mtx *= glm::scale(glm::mat4(1), *animData->scale);
    else if(node.has_scale)
        mtx *= glm::scale(glm::mat4(1), vec3(node.scale[0], node.scale[1], node.scale[2]));

    CSpan<cgltf_node*> children(node.children, node.children_count);
    for(cgltf_node* child : children) {
        assert(child);
        calcNodesMatricesRecursive(*child, mtx);
    }
}